

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmem.c
# Opt level: O1

void * luaM_realloc_(lua_State *L,void *block,size_t osize,size_t nsize)

{
  global_State *pgVar1;
  void *pvVar2;
  
  pgVar1 = L->l_G;
  pvVar2 = (*pgVar1->frealloc)(pgVar1->ud,block,osize,nsize);
  if ((nsize != 0) && (pvVar2 == (void *)0x0)) {
    if (pgVar1->version == (lua_Number *)0x0) {
      pvVar2 = (void *)0x0;
    }
    else {
      luaC_fullgc(L,1);
      pvVar2 = (*pgVar1->frealloc)(pgVar1->ud,block,osize,nsize);
    }
    if (pvVar2 == (void *)0x0) {
      luaD_throw(L,4);
    }
  }
  if (block == (void *)0x0) {
    osize = 0;
  }
  pgVar1->GCdebt = pgVar1->GCdebt + (nsize - osize);
  return pvVar2;
}

Assistant:

void *luaM_realloc_ (lua_State *L, void *block, size_t osize, size_t nsize) {
  void *newblock;
  global_State *g = G(L);
  size_t realosize = (block) ? osize : 0;
  lua_assert((realosize == 0) == (block == NULL));
#if defined(HARDMEMTESTS)
  if (nsize > realosize && g->gcrunning)
    luaC_fullgc(L, 1);  /* force a GC whenever possible */
#endif
  newblock = (*g->frealloc)(g->ud, block, osize, nsize);
  if (newblock == NULL && nsize > 0) {
    lua_assert(nsize > realosize);  /* cannot fail when shrinking a block */
    if (g->version) {  /* is state fully built? */
      luaC_fullgc(L, 1);  /* try to free some memory... */
      newblock = (*g->frealloc)(g->ud, block, osize, nsize);  /* try again */
    }
    if (newblock == NULL)
      luaD_throw(L, LUA_ERRMEM);
  }
  lua_assert((nsize == 0) == (newblock == NULL));
  g->GCdebt = (g->GCdebt + nsize) - realosize;
  return newblock;
}